

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorpickermenu.cpp
# Opt level: O3

void __thiscall DColorPickerMenu::Destroy(DColorPickerMenu *this)

{
  uint *puVar1;
  FOptionMenuItem *pFVar2;
  uint amount;
  UCVarValue value;
  uint uVar3;
  uint i;
  int iVar4;
  FOptionMenuDescriptor *pFVar5;
  
  if (-1 < this->mStartItem) {
    iVar4 = 0;
    do {
      pFVar5 = (this->super_DOptionMenu).mDesc;
      uVar3 = this->mStartItem;
      pFVar2 = (pFVar5->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
               [iVar4 + uVar3];
      if (pFVar2 != (FOptionMenuItem *)0x0) {
        (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[1])();
        pFVar5 = (this->super_DOptionMenu).mDesc;
        uVar3 = this->mStartItem;
      }
      puVar1 = &(pFVar5->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
      amount = uVar3 - *puVar1;
      if (*puVar1 <= uVar3 && amount != 0) {
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                  (&(pFVar5->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,amount);
      }
      (pFVar5->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar3;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 8);
    if (this->mCVar != (FColorCVar *)0x0) {
      value._0_4_ = (int)this->mBlue | (int)this->mGreen << 8 | (int)this->mRed << 0x10;
      value._4_4_ = 0;
      FBaseCVar::SetGenericRep((FBaseCVar *)this->mCVar,value,CVAR_Int);
    }
    this->mStartItem = -1;
  }
  return;
}

Assistant:

void Destroy() override
	{
		if (mStartItem >= 0)
		{
			for(unsigned i=0;i<8;i++)
			{
				delete mDesc->mItems[mStartItem+i];
				mDesc->mItems.Resize(mStartItem);
			}
			UCVarValue val;
			val.Int = MAKERGB(int(mRed), int(mGreen), int(mBlue));
			if (mCVar != NULL) mCVar->SetGenericRep (val, CVAR_Int);
			mStartItem = -1;
		}
	}